

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so2.hpp
# Opt level: O2

void __thiscall
Sophus::SO2Base<Sophus::SO2<float,_0>_>::normalize(SO2Base<Sophus::SO2<float,_0>_> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  
  uVar1 = *(ulong *)this;
  fVar5 = (float)(uVar1 >> 0x20);
  fVar5 = fVar5 * fVar5;
  fVar4 = SQRT((float)uVar1 * (float)uVar1 + fVar5);
  if (fVar4 < 1e-05) {
    defaultEnsure<>("void Sophus::SO2Base<Sophus::SO2<float>>::normalize() [Derived = Sophus::SO2<float>]"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/powei-lin[P]OpticalFlowTracker/thirdparty/Sophus/sophus/so2.hpp"
                    ,0x8a,"Complex number should not be close to zero!");
    uVar1 = *(ulong *)this;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar3._4_4_ = fVar4;
  auVar3._0_4_ = fVar4;
  auVar3._8_4_ = fVar5;
  auVar3._12_4_ = fVar5;
  auVar3 = divps(auVar2,auVar3);
  *(long *)this = auVar3._0_8_;
  return;
}

Assistant:

SOPHUS_FUNC void normalize() {
    Scalar length = std::sqrt(unit_complex().x() * unit_complex().x() +
                              unit_complex().y() * unit_complex().y());
    SOPHUS_ENSURE(length >= Constants<Scalar>::epsilon(),
                  "Complex number should not be close to zero!");
    unit_complex_nonconst().x() /= length;
    unit_complex_nonconst().y() /= length;
  }